

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

void PtsToRegion(int numFullPtBlocks,int iCurPtBlock,POINTBLOCK *FirstPtBlock,QRegionPrivate *reg)

{
  int iVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  long lVar5;
  qsizetype qVar6;
  QRect *rect;
  QVarLengthArray<QRegionSpan,_256LL> *in_RCX;
  bool *in_RDX;
  int in_ESI;
  int in_EDI;
  long in_FS_OFFSET;
  int i_2;
  int i_1;
  QPoint *next;
  int width;
  QPoint *pts;
  int i;
  POINTBLOCK *CurPtBlock;
  qsizetype rowSize;
  bool needsExtend;
  int extendTo;
  int lastRow;
  QVarLengthArray<QRegionSpan,_256LL> row;
  QVLABase<QRegionSpan> *in_stack_fffffffffffff708;
  QVarLengthArray<QRegionSpan,_256LL> *in_stack_fffffffffffff710;
  undefined8 in_stack_fffffffffffff718;
  QRect *in_stack_fffffffffffff720;
  QRegionPrivate *this;
  int *in_stack_fffffffffffff748;
  int *lastRow_00;
  int in_stack_fffffffffffff758;
  int in_stack_fffffffffffff75c;
  int in_stack_fffffffffffff760;
  undefined4 in_stack_fffffffffffff768;
  undefined4 in_stack_fffffffffffff76c;
  long local_880;
  int local_874;
  long local_868;
  int local_84c;
  value_type local_848;
  long local_840;
  size_type local_838;
  undefined1 local_829 [9];
  QVarLengthArray<QRegionSpan,_256LL> local_820;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_829._5_4_ = 0;
  local_829._1_4_ = 0;
  local_829[0] = 0;
  memset(local_829 + 9,0xaa,0x818);
  QVarLengthArray<QRegionSpan,_256LL>::QVarLengthArray
            ((QVarLengthArray<QRegionSpan,_256LL> *)(local_829 + 9));
  local_868 = 0;
  QRect::setLeft((QRect *)in_stack_fffffffffffff710,(int)((ulong)in_stack_fffffffffffff708 >> 0x20))
  ;
  QRect::setRight((QRect *)in_stack_fffffffffffff710,(int)((ulong)in_stack_fffffffffffff708 >> 0x20)
                 );
  *(undefined4 *)((long)&((DataPointer *)&in_RCX->super_QVLABase<QRegionSpan>)->d + 4) = 0xffffffff;
  local_84c = in_EDI;
  do {
    if (local_84c < 0) {
      iVar1 = local_829._5_4_;
      if ((local_829[0] & 1) != 0) {
        for (; lVar5 = (long)iVar1,
            qVar6 = QList<QRect>::size((QList<QRect> *)
                                       &((DataPointer *)&in_RCX->super_QVLABase<QRegionSpan>)->ptr),
            lVar5 < qVar6; iVar1 = iVar1 + 1) {
          QList<QRect>::operator[]
                    ((QList<QRect> *)in_stack_fffffffffffff710,(qsizetype)in_stack_fffffffffffff708)
          ;
          QRect::setBottom((QRect *)in_stack_fffffffffffff710,
                           (int)((ulong)in_stack_fffffffffffff708 >> 0x20));
        }
      }
      qVar6 = QList<QRect>::size((QList<QRect> *)
                                 &((DataPointer *)&in_RCX->super_QVLABase<QRegionSpan>)->ptr);
      *(int *)&((DataPointer *)&in_RCX->super_QVLABase<QRegionSpan>)->d = (int)qVar6;
      if (*(int *)&((DataPointer *)&in_RCX->super_QVLABase<QRegionSpan>)->d == 0) {
        QRect::setCoords(in_stack_fffffffffffff720,(int)((ulong)in_stack_fffffffffffff718 >> 0x20),
                         (int)in_stack_fffffffffffff718,
                         (int)((ulong)in_stack_fffffffffffff710 >> 0x20),
                         (int)in_stack_fffffffffffff710);
      }
      else {
        this = (QRegionPrivate *)((in_RCX->super_QVLAStorage<8UL,_4UL,_256LL>).array + 8);
        QList<QRect>::operator[]
                  ((QList<QRect> *)in_stack_fffffffffffff710,(qsizetype)in_stack_fffffffffffff708);
        QRect::top((QRect *)0x658ca1);
        QRect::setTop((QRect *)in_stack_fffffffffffff710,
                      (int)((ulong)in_stack_fffffffffffff708 >> 0x20));
        QList<QRect>::operator[]
                  ((QList<QRect> *)in_stack_fffffffffffff710,(qsizetype)in_stack_fffffffffffff708);
        QRect::bottom((QRect *)0x658cdf);
        QRect::setBottom((QRect *)in_stack_fffffffffffff710,
                         (int)((ulong)in_stack_fffffffffffff708 >> 0x20));
        iVar1 = 0;
        while( true ) {
          rect = (QRect *)(long)iVar1;
          qVar6 = QList<QRect>::size((QList<QRect> *)
                                     &((DataPointer *)&in_RCX->super_QVLABase<QRegionSpan>)->ptr);
          if (qVar6 <= (long)rect) break;
          in_stack_fffffffffffff710 = in_RCX;
          QList<QRect>::operator[]((QList<QRect> *)in_RCX,(qsizetype)in_stack_fffffffffffff708);
          QRegionPrivate::updateInnerRect(this,rect);
          iVar1 = iVar1 + 1;
        }
      }
      QVarLengthArray<QRegionSpan,_256LL>::~QVarLengthArray(in_stack_fffffffffffff710);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    local_874 = 100;
    if (local_84c == 0) {
      local_874 = in_ESI >> 1;
    }
    if (local_874 != 0) {
      local_838 = QVLABaseBase::size((QVLABaseBase *)(local_829 + 9));
      local_840 = local_868 + local_874;
      qMax<long_long>(&local_838,&local_840);
      QVarLengthArray<QRegionSpan,_256LL>::resize
                (in_stack_fffffffffffff710,(qsizetype)in_stack_fffffffffffff708);
      local_880 = *(long *)(in_RDX + 0x640);
      while (local_874 != 0) {
        iVar1 = QPoint::x((QPoint *)0x658993);
        iVar2 = QPoint::x((QPoint *)0x6589a1);
        if (iVar1 != iVar2) {
          if (local_868 != 0) {
            pvVar4 = QVLABase<QRegionSpan>::operator[](in_stack_fffffffffffff708,0x6589dc);
            in_stack_fffffffffffff760 = pvVar4->x2;
            iVar2 = QPoint::x((QPoint *)0x6589ed);
            if (in_stack_fffffffffffff760 == iVar2) {
              in_stack_fffffffffffff75c = QPoint::x((QPoint *)0x658a05);
              pvVar4 = QVLABase<QRegionSpan>::operator[](in_stack_fffffffffffff708,0x658a22);
              pvVar4->x2 = in_stack_fffffffffffff75c;
              goto LAB_00658a8b;
            }
          }
          in_stack_fffffffffffff758 = QPoint::x((QPoint *)0x658a35);
          iVar2 = QPoint::x((QPoint *)0x658a47);
          QRegionSpan::QRegionSpan(&local_848,in_stack_fffffffffffff758,iVar2);
          local_868 = local_868 + 1;
          pvVar4 = QVLABase<QRegionSpan>::operator[](in_stack_fffffffffffff708,0x658a7e);
          *pvVar4 = local_848;
        }
LAB_00658a8b:
        if (local_868 != 0) {
          if (local_874 + -1 == 0) {
            if ((local_84c == 0) || (in_ESI == 0)) {
              in_stack_fffffffffffff748 = (int *)0x0;
              lastRow_00 = in_stack_fffffffffffff748;
            }
            else {
              in_stack_fffffffffffff748 = *(int **)(*(long *)(in_RDX + 0x648) + 0x640);
              lastRow_00 = in_stack_fffffffffffff748;
            }
          }
          else {
            lastRow_00 = (int *)(local_880 + 0x10);
          }
          if (lastRow_00 != (int *)0x0) {
            iVar2 = QPoint::y((QPoint *)0x658b14);
            iVar3 = QPoint::y((QPoint *)0x658b22);
            if (iVar2 == iVar3) goto LAB_00658b90;
          }
          QVLABase<QRegionSpan>::data((QVLABase<QRegionSpan> *)(local_829 + 9));
          QPoint::y((QPoint *)0x658b48);
          in_stack_fffffffffffff708 = (QVLABase<QRegionSpan> *)local_829;
          flushRow((QRegionSpan *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
                   iVar1,in_stack_fffffffffffff760,
                   (QRegionPrivate *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                   lastRow_00,in_stack_fffffffffffff748,in_RDX);
          local_868 = 0;
        }
LAB_00658b90:
        local_880 = local_880 + 0x10;
        local_874 = local_874 + -1;
      }
    }
    in_RDX = *(bool **)(in_RDX + 0x648);
    local_84c = local_84c + -1;
  } while( true );
}

Assistant:

static void PtsToRegion(int numFullPtBlocks, int iCurPtBlock,
                       POINTBLOCK *FirstPtBlock, QRegionPrivate *reg)
{
    int lastRow = 0;
    int extendTo = 0;
    bool needsExtend = false;
    QVarLengthArray<QRegionSpan> row;
    qsizetype rowSize = 0;

    reg->extents.setLeft(INT_MAX);
    reg->extents.setRight(INT_MIN);
    reg->innerArea = -1;

    POINTBLOCK *CurPtBlock = FirstPtBlock;
    for (; numFullPtBlocks >= 0; --numFullPtBlocks) {
        /* the loop uses 2 points per iteration */
        int i = NUMPTSTOBUFFER >> 1;
        if (!numFullPtBlocks)
            i = iCurPtBlock >> 1;
        if(i) {
            row.resize(qMax(row.size(), rowSize + i));
            for (QPoint *pts = CurPtBlock->pts; i--; pts += 2) {
                const int width = pts[1].x() - pts[0].x();
                if (width) {
                    if (rowSize && row[rowSize-1].x2 == pts[0].x())
                        row[rowSize-1].x2 = pts[1].x();
                    else
                        row[rowSize++] = QRegionSpan(pts[0].x(), pts[1].x());
                }

                if (rowSize) {
                    QPoint *next = i ? &pts[2] : (numFullPtBlocks && iCurPtBlock ? CurPtBlock->next->pts : nullptr);

                    if (!next || next->y() != pts[0].y()) {
                        flushRow(row.data(), pts[0].y(), rowSize, reg, &lastRow, &extendTo, &needsExtend);
                        rowSize = 0;
                    }
                }
            }
        }
        CurPtBlock = CurPtBlock->next;
    }

    if (needsExtend) {
        for (int i = lastRow; i < reg->rects.size(); ++i)
            reg->rects[i].setBottom(extendTo);
    }

    reg->numRects = reg->rects.size();

    if (reg->numRects) {
        reg->extents.setTop(reg->rects[0].top());
        reg->extents.setBottom(reg->rects[lastRow].bottom());

        for (int i = 0; i < reg->rects.size(); ++i)
            reg->updateInnerRect(reg->rects[i]);
    } else {
        reg->extents.setCoords(0, 0, 0, 0);
    }
}